

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

IVec2 __thiscall
eglu::getSurfaceResolution(eglu *this,Library *egl,EGLDisplay display,EGLSurface surface)

{
  EGLint EVar1;
  EGLint EVar2;
  NotSupportedError *this_00;
  
  EVar1 = querySurfaceInt(egl,display,surface,0x3090);
  EVar2 = querySurfaceInt(egl,display,surface,0x3091);
  if ((EVar1 != -1) && (EVar2 != -1)) {
    *(EGLint *)this = EVar1;
    *(EGLint *)(this + 4) = EVar2;
    return (IVec2)(int  [2])this;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Surface doesn\'t support pixel density queries",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0xde);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::IVec2 getSurfaceResolution (const Library& egl, EGLDisplay display, EGLSurface surface)
{
	const EGLint hRes	= querySurfaceInt(egl, display, surface, EGL_HORIZONTAL_RESOLUTION);
	const EGLint vRes	= querySurfaceInt(egl, display, surface, EGL_VERTICAL_RESOLUTION);

	if (hRes == EGL_UNKNOWN || vRes == EGL_UNKNOWN)
		TCU_THROW(NotSupportedError, "Surface doesn't support pixel density queries");
	return tcu::IVec2(hRes, vRes);
}